

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  
  bVar1 = test();
  pcVar3 = "you have a bug of some kind";
  if (bVar1) {
    pcVar3 = "your code is ok!";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  return 0;
}

Assistant:

int main() {
  bool ok(test());
  if (ok)
    cout << "your code is ok!" << endl;
  else
    cout << "you have a bug of some kind" << endl;
  return 0;
}